

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Parser::variable_storage_is_aliased(Parser *this,SPIRVariable *v)

{
  uint32_t id;
  byte local_a2;
  byte local_a1;
  bool local_91;
  bool local_81;
  Bitset local_70;
  byte local_30;
  byte local_2f;
  byte local_2e;
  bool local_2d;
  uint32_t local_2c;
  bool is_restrict;
  bool counter;
  bool image;
  bool ssbo;
  Meta *type_meta;
  SPIRType *type;
  SPIRVariable *v_local;
  Parser *this_local;
  
  type = (SPIRType *)v;
  v_local = (SPIRVariable *)this;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(v->super_IVariant).field_0xc);
  type_meta = (Meta *)get<diligent_spirv_cross::SPIRType>(this,id);
  local_2c = ((ID *)&(type_meta->decoration).alias._M_string_length)->id;
  _is_restrict = ParsedIR::find_meta(&this->ir,(ID)local_2c);
  local_81 = true;
  if (type->basetype != Half) {
    local_91 = false;
    if (_is_restrict != (Meta *)0x0) {
      local_91 = Bitset::get(&(_is_restrict->decoration).decoration_flags,3);
    }
    local_81 = local_91;
  }
  local_2d = local_81;
  local_2e = *(int *)&(type_meta->decoration).alias.field_2 == 0x10;
  local_2f = *(int *)&(type_meta->decoration).alias.field_2 == 0xb;
  if (local_81 == false) {
    local_30 = ParsedIR::has_decoration
                         (&this->ir,(ID)(type->super_IVariant).self.id,DecorationRestrict);
  }
  else {
    ParsedIR::get_buffer_block_flags(&local_70,&this->ir,(SPIRVariable *)type);
    local_30 = Bitset::get(&local_70,0x13);
    Bitset::~Bitset(&local_70);
  }
  local_a1 = 0;
  if ((local_30 & 1) == 0) {
    local_a2 = 1;
    if (((local_2d & 1U) == 0) && (local_a2 = 1, (local_2e & 1) == 0)) {
      local_a2 = local_2f;
    }
    local_a1 = local_a2;
  }
  return (bool)(local_a1 & 1);
}

Assistant:

bool Parser::variable_storage_is_aliased(const SPIRVariable &v) const
{
	auto &type = get<SPIRType>(v.basetype);

	auto *type_meta = ir.find_meta(type.self);

	bool ssbo = v.storage == StorageClassStorageBuffer ||
	            (type_meta && type_meta->decoration.decoration_flags.get(DecorationBufferBlock));
	bool image = type.basetype == SPIRType::Image;
	bool counter = type.basetype == SPIRType::AtomicCounter;

	bool is_restrict;
	if (ssbo)
		is_restrict = ir.get_buffer_block_flags(v).get(DecorationRestrict);
	else
		is_restrict = ir.has_decoration(v.self, DecorationRestrict);

	return !is_restrict && (ssbo || image || counter);
}